

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XercesXPath::serialize(XercesXPath *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  XercesXPath *this_local;
  
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(serEng,this->fEmptyNamespaceId);
    XSerializeEngine::writeString(serEng,this->fExpression,0,false);
    XTemplateSerializer::storeObject(this->fLocationPaths,serEng);
  }
  else {
    XSerializeEngine::operator>>(serEng,&this->fEmptyNamespaceId);
    XSerializeEngine::readString(serEng,&this->fExpression);
    XTemplateSerializer::loadObject(&this->fLocationPaths,8,true,serEng);
  }
  return;
}

Assistant:

void XercesXPath::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fEmptyNamespaceId;
        serEng.writeString(fExpression);

        /***
         * Serialize RefVectorOf<XercesLocationPath>* fLocationPaths;
         ***/
        XTemplateSerializer::storeObject(fLocationPaths, serEng);
    }
    else
    {
        serEng>>fEmptyNamespaceId;
        serEng.readString(fExpression);

        /***
         * Deserialize RefVectorOf<XercesLocationPath>* fLocationPaths;
         ***/
        XTemplateSerializer::loadObject(&fLocationPaths, 8, true, serEng);
    }
}